

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc2.c
# Opt level: O0

Aig_Obj_t * Saig_BmcIntervalToAig_rec(Saig_Bmc_t *p,Aig_Man_t *pNew,Aig_Obj_t *pObj)

{
  Vec_Int_t *p_00;
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *p1;
  Aig_Obj_t *pObj_local;
  Aig_Man_t *pNew_local;
  Saig_Bmc_t *p_local;
  
  if ((pObj->field_5).pData == (void *)0x0) {
    p_00 = p->vVisited;
    iVar1 = Aig_ObjId(pObj);
    Vec_IntPush(p_00,iVar1);
    iVar1 = Saig_BmcSatNum(p,pObj);
    if ((iVar1 == 0) && (iVar1 = Aig_ObjIsCi(pObj), iVar1 == 0)) {
      pAVar2 = Aig_ObjFanin0(pObj);
      Saig_BmcIntervalToAig_rec(p,pNew,pAVar2);
      pAVar2 = Aig_ObjFanin1(pObj);
      Saig_BmcIntervalToAig_rec(p,pNew,pAVar2);
      if ((pObj->field_5).pData == (void *)0x0) {
        pAVar2 = Aig_ObjChild0Copy(pObj);
        p1 = Aig_ObjChild1Copy(pObj);
        pAVar2 = Aig_And(pNew,pAVar2,p1);
        (pObj->field_5).pData = pAVar2;
        return pAVar2;
      }
      __assert_fail("pObj->pData == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcBmc2.c"
                    ,0x1fc,
                    "Aig_Obj_t *Saig_BmcIntervalToAig_rec(Saig_Bmc_t *, Aig_Man_t *, Aig_Obj_t *)");
    }
    iVar1 = Aig_ObjIsCi(pObj);
    p->nStitchVars = (uint)((iVar1 != 0 ^ 0xffU) & 1) + p->nStitchVars;
    p_local = (Saig_Bmc_t *)Aig_ObjCreateCi(pNew);
    (pObj->field_5).pData = p_local;
  }
  else {
    p_local = (Saig_Bmc_t *)(pObj->field_5).pData;
  }
  return (Aig_Obj_t *)p_local;
}

Assistant:

Aig_Obj_t * Saig_BmcIntervalToAig_rec( Saig_Bmc_t * p, Aig_Man_t * pNew, Aig_Obj_t * pObj )
{
    if ( pObj->pData )
        return (Aig_Obj_t *)pObj->pData;
    Vec_IntPush( p->vVisited, Aig_ObjId(pObj) );
    if ( Saig_BmcSatNum(p, pObj) || Aig_ObjIsCi(pObj) )
    {
        p->nStitchVars += !Aig_ObjIsCi(pObj);
        return (Aig_Obj_t *)(pObj->pData = Aig_ObjCreateCi(pNew));
    }
    Saig_BmcIntervalToAig_rec( p, pNew, Aig_ObjFanin0(pObj) );
    Saig_BmcIntervalToAig_rec( p, pNew, Aig_ObjFanin1(pObj) );
    assert( pObj->pData == NULL );
    return (Aig_Obj_t *)(pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) ));
}